

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_quicblock(void)

{
  size_t sVar1;
  uint8_t *puVar2;
  int iVar3;
  uint64_t uVar4;
  uint8_t *puVar5;
  long lVar6;
  ptls_buffer_t local_58;
  uint8_t *_src;
  
  local_58.base = "";
  local_58.capacity = 0;
  local_58.off = 0;
  local_58.is_allocated = 0;
  iVar3 = ptls_buffer__do_pushv(&local_58,"",1);
  sVar1 = local_58.off;
  if (iVar3 == 0) {
    iVar3 = ptls_buffer__do_pushv(&local_58,"abc",3);
    if (iVar3 == 0) {
      iVar3 = ptls_buffer__adjust_quic_blocksize(&local_58,local_58.off - sVar1);
      if (iVar3 == 0) {
        puVar5 = local_58.base + local_58.off;
        _src = local_58.base;
        uVar4 = ptls_decode_quicint(&_src,puVar5);
        puVar2 = _src;
        if (uVar4 <= (ulong)((long)puVar5 - (long)_src) && uVar4 != 0xffffffffffffffff) {
          _ok((uint)(uVar4 == 3),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x5ea);
          iVar3 = bcmp(puVar2,"abc",3);
          _ok((uint)(iVar3 == 0),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x5eb);
          if (uVar4 == 3 && puVar2 + 3 == puVar5) {
            local_58.off = 0;
            iVar3 = ptls_buffer__do_pushv(&local_58,"",1);
            sVar1 = local_58.off;
            if (iVar3 == 0) {
              iVar3 = ptls_buffer_reserve(&local_58,0x7b);
              if (iVar3 == 0) {
                builtin_memcpy(local_58.base + local_58.off,
                               "UUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUU"
                               ,0x7b);
                local_58.off = local_58.off + 0x7b;
                iVar3 = ptls_buffer__adjust_quic_blocksize(&local_58,local_58.off - sVar1);
                if (iVar3 == 0) {
                  puVar5 = local_58.base + local_58.off;
                  _src = local_58.base;
                  uVar4 = ptls_decode_quicint(&_src,puVar5);
                  puVar2 = _src;
                  if (uVar4 <= (ulong)((long)puVar5 - (long)_src) && uVar4 != 0xffffffffffffffff) {
                    _ok((uint)(uVar4 == 0x7b),"%s %d",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                        ,0x5f9);
                    for (lVar6 = 0; lVar6 != 0x7b; lVar6 = lVar6 + 1) {
                      _ok((uint)(puVar2[lVar6] == 'U'),"%s %d",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                          ,0x5fc);
                    }
                    if (puVar2 + 0x7b == puVar5 && uVar4 == 0x7b) goto LAB_00122268;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  _ok(0,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x601)
  ;
LAB_00122268:
  ptls_buffer_dispose(&local_58);
  return;
}

Assistant:

static void test_quicblock(void)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int ret;

    ptls_buffer_init(&buf, "", 0);

    ptls_buffer_push_block(&buf, -1, { ptls_buffer_pushv(&buf, "abc", 3); });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 3);
        ok(memcmp(src, "abc", 3) == 0);
        src += 3;
    });

    buf.off = 0;
    ptls_buffer_push_block(&buf, -1, {
        if ((ret = ptls_buffer_reserve(&buf, 123)) != 0)
            goto Exit;
        memset(buf.base + buf.off, 0x55, 123);
        buf.off += 123;
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 123);
        size_t i;
        for (i = 0; i != 123; ++i)
            ok(*src++ == 0x55);
    });

Exit:
    if (ret != 0)
        ok(!"fail");
    ptls_buffer_dispose(&buf);
}